

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readPhotonProduction.hpp
# Opt level: O3

PhotonProduction * __thiscall
njoy::ENDFtk::section::Type<12>::
readPhotonProduction<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (PhotonProduction *__return_storage_ptr__,Type<12> *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT,int LO,int N)

{
  undefined8 *puVar1;
  _Storage<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_false> local_d8;
  char local_48;
  vector<njoy::ENDFtk::section::Type<12>::PartialMultiplicity,_std::allocator<njoy::ENDFtk::section::Type<12>::PartialMultiplicity>_>
  local_40;
  
  if (MT == 2) {
    TransitionProbabilities::
    TransitionProbabilities<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((TransitionProbabilities *)&local_d8._M_value,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,(int)lineNumber,MAT,MF);
    *(_Tuple_impl<5UL,_long> *)
     &(__return_storage_ptr__->
      super__Variant_base<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
      ).
      super__Move_assign_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
      .
      super__Copy_assign_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
      .
      super__Move_ctor_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
      .
      super__Copy_ctor_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
      .
      super__Variant_storage_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
      ._M_u = local_d8._M_value.super_TabulationRecord.super_InterpolationBase.metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
              super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>._M_head_impl;
    ((_Head_base<4UL,_long,_false> *)
    ((long)&(__return_storage_ptr__->
            super__Variant_base<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
            ).
            super__Move_assign_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
            .
            super__Copy_assign_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
            .
            super__Move_ctor_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
            .
            super__Copy_ctor_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
            .
            super__Variant_storage_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
            ._M_u + 8))->_M_head_impl =
         (long)local_d8._M_value.super_TabulationRecord.super_InterpolationBase.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
               super__Head_base<4UL,_long,_false>._M_head_impl;
    ((_Head_base<3UL,_long,_false> *)
    ((long)&(__return_storage_ptr__->
            super__Variant_base<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
            ).
            super__Move_assign_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
            .
            super__Copy_assign_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
            .
            super__Move_ctor_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
            .
            super__Copy_ctor_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
            .
            super__Variant_storage_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
            ._M_u + 0x10))->_M_head_impl =
         (long)local_d8._M_value.super_TabulationRecord.super_InterpolationBase.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
               _M_head_impl;
    ((_Head_base<2UL,_long,_false> *)
    ((long)&(__return_storage_ptr__->
            super__Variant_base<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
            ).
            super__Move_assign_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
            .
            super__Copy_assign_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
            .
            super__Move_ctor_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
            .
            super__Copy_ctor_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
            .
            super__Variant_storage_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
            ._M_u + 0x18))->_M_head_impl =
         (long)local_d8._M_value.super_TabulationRecord.super_InterpolationBase.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
               _M_head_impl;
    ((_Head_base<1UL,_double,_false> *)
    ((long)&(__return_storage_ptr__->
            super__Variant_base<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
            ).
            super__Move_assign_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
            .
            super__Copy_assign_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
            .
            super__Move_ctor_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
            .
            super__Copy_ctor_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
            .
            super__Variant_storage_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
            ._M_u + 0x20))->_M_head_impl =
         (double)local_d8._M_value.super_TabulationRecord.super_InterpolationBase.metadata.fields.
                 super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                 super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                 super__Head_base<1UL,_double,_false>._M_head_impl;
    ((_Head_base<0UL,_double,_false> *)
    ((long)&(__return_storage_ptr__->
            super__Variant_base<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
            ).
            super__Move_assign_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
            .
            super__Copy_assign_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
            .
            super__Move_ctor_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
            .
            super__Copy_ctor_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
            .
            super__Variant_storage_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
            ._M_u + 0x28))->_M_head_impl =
         (double)local_d8._M_value.super_TabulationRecord.super_InterpolationBase.metadata.fields.
                 super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                 super__Head_base<0UL,_double,_false>._M_head_impl;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
             ._M_u + 0x30) =
         local_d8._M_value.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
             ._M_u + 0x38) =
         local_d8._M_value.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
             ._M_u + 0x40) =
         local_d8._M_value.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    (__return_storage_ptr__->
    super__Variant_base<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
    ).
    super__Move_assign_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
    .
    super__Copy_assign_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
    .
    super__Move_ctor_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
    .
    super__Copy_ctor_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
    .
    super__Variant_storage_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
    ._M_index = '\x01';
  }
  else {
    if (MT != 1) {
      tools::Log::error<char_const*>("Encountered illegal LO value");
      tools::Log::info<char_const*>("LO is either 1 (multiplicities) or 2 (probabilities)");
      tools::Log::info<char_const*,int>("LO value: {}",MT);
      tools::Log::info<char_const*,long>("Line number: {}",(long)end->_M_current);
      puVar1 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar1 = getenv;
      __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
    }
    Multiplicities::Multiplicities<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((Multiplicities *)&local_d8._M_value,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,(int)lineNumber,MAT,MF,LO);
    std::__detail::__variant::_Uninitialized<njoy::ENDFtk::section::Type<12>::Multiplicities,_false>
    ::_Uninitialized<njoy::ENDFtk::section::Type<12>::Multiplicities>
              ((_Uninitialized<njoy::ENDFtk::section::Type<12>::Multiplicities,_false> *)
               __return_storage_ptr__,&local_d8);
    (__return_storage_ptr__->
    super__Variant_base<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
    ).
    super__Move_assign_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
    .
    super__Copy_assign_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
    .
    super__Move_ctor_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
    .
    super__Copy_ctor_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
    .
    super__Variant_storage_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
    ._M_index = '\0';
    std::
    vector<njoy::ENDFtk::section::Type<12>::PartialMultiplicity,_std::allocator<njoy::ENDFtk::section::Type<12>::PartialMultiplicity>_>
    ::~vector(&local_40);
    if (local_48 == '\x01') {
      std::_Optional_payload_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity>::_M_destroy
                ((_Optional_payload_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity> *)
                 &local_d8._M_value);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static PhotonProduction
readPhotonProduction( Iterator& begin,
                      const Iterator& end,
                      long& lineNumber,
                      int MAT,
                      int MF,
                      int MT,
                      int LO,
                      int N ) {

  switch ( LO ) {
    case 1: return Multiplicities( begin, end, lineNumber, MAT, MF, MT, N );
    case 2: return TransitionProbabilities( begin, end, lineNumber, MAT, MF, MT );
    default : {
      Log::error( "Encountered illegal LO value" );
      Log::info( "LO is either 1 (multiplicities) or 2 (probabilities)" );
      Log::info( "LO value: {}", LO );
      Log::info( "Line number: {}", lineNumber );
      throw std::exception();
    }
  }
}